

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O1

int * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::get_payload
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          int *key)

{
  longlong *plVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  self_type *psVar5;
  uint uVar6;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *pAVar7;
  int *piVar8;
  long lVar9;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *unaff_RBX;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *pAVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 in_XMM0_Qa;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  plVar1 = &(this->stats_).num_lookups;
  *plVar1 = *plVar1 + 1;
  pAVar7 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *
           )this->root_node_;
  pAVar10 = pAVar7;
  if ((pAVar7->super_AlexNode<int,_int>).is_leaf_ == false) {
    iVar4 = *key;
    auVar15._0_8_ = (double)iVar4;
    auVar15._8_8_ = in_XMM0_Qa;
    lVar9 = (this->stats_).num_node_lookups;
    auVar16._8_8_ = 0x7fffffffffffffff;
    auVar16._0_8_ = 0x7fffffffffffffff;
    do {
      auVar18._8_8_ = 0;
      auVar18._0_8_ = (pAVar7->super_AlexNode<int,_int>).model_.a_;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (pAVar7->super_AlexNode<int,_int>).model_.b_;
      auVar2 = vfmadd213sd_fma(auVar18,auVar15,auVar2);
      dVar17 = auVar2._0_8_;
      uVar6 = *(int *)&pAVar7->allocator_ - 1;
      uVar11 = ~((int)dVar17 >> 0x1f) & (int)dVar17;
      if ((int)uVar11 <= (int)uVar6) {
        uVar6 = uVar11;
      }
      pAVar7 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                *)(&(pAVar7->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[(int)uVar6];
      bVar3 = (pAVar7->super_AlexNode<int,_int>).is_leaf_;
      if (bVar3 == true) {
        lVar9 = lVar9 + (pAVar7->super_AlexNode<int,_int>).level_;
        (this->stats_).num_node_lookups = lVar9;
        auVar18 = vcvtdq2pd_avx(ZEXT416((uint)(int)(dVar17 + 0.5)));
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dVar17 - auVar18._0_8_;
        auVar2 = vandpd_avx(auVar19,auVar16);
        unaff_RBX = pAVar7;
        if (auVar2._0_8_ <= dVar17 * 2.220446049250313e-15) {
          if (auVar18._0_8_ <= dVar17) {
            pAVar10 = pAVar7->prev_leaf_;
            if (pAVar10 !=
                (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 *)0x0) {
              iVar12 = pAVar10->data_capacity_;
              uVar13 = (long)(iVar12 + -1);
              do {
                uVar14 = uVar13;
                if (iVar12 < 1) {
                  iVar12 = -0x80000000;
                  goto LAB_00142aa2;
                }
                iVar12 = iVar12 + -1;
                uVar13 = uVar14 - 1;
              } while ((pAVar10->bitmap_[uVar14 >> 6 & 0x3ffffff] >> (uVar14 & 0x3f) & 1) == 0);
              iVar12 = pAVar10->key_slots_[uVar14];
LAB_00142aa2:
              unaff_RBX = pAVar10;
              if (iVar12 < iVar4) {
                unaff_RBX = pAVar7;
              }
            }
          }
          else {
            psVar5 = pAVar7->next_leaf_;
            if (psVar5 != (self_type *)0x0) {
              iVar12 = 0x7fffffff;
              if (0 < psVar5->data_capacity_) {
                uVar13 = 0;
                do {
                  if ((psVar5->bitmap_[uVar13 >> 6 & 0x3ffffff] >> (uVar13 & 0x3f) & 1) != 0) {
                    iVar12 = psVar5->key_slots_[uVar13];
                    break;
                  }
                  uVar13 = uVar13 + 1;
                } while (psVar5->data_capacity_ != (int)uVar13);
              }
              unaff_RBX = psVar5;
              if (iVar4 < iVar12) {
                unaff_RBX = pAVar7;
              }
            }
          }
        }
      }
      pAVar10 = unaff_RBX;
    } while (bVar3 == false);
  }
  uVar6 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
          find_key(pAVar10,key);
  if ((int)uVar6 < 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = pAVar10->payload_slots_ + uVar6;
  }
  return piVar8;
}

Assistant:

P* get_payload(const T& key) const {
    stats_.num_lookups++;
    data_node_type* leaf = get_leaf(key);
    int idx = leaf->find_key(key);
    if (idx < 0) {
      return nullptr;
    } else {
      return &(leaf->get_payload(idx));
    }
  }